

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearrayview.h
# Opt level: O0

qsizetype __thiscall QByteArrayView::indexOf(QByteArrayView *this,char ch,qsizetype from)

{
  qsizetype qVar1;
  long in_FS_OFFSET;
  qsizetype unaff_retaddr;
  undefined1 in_stack_00000020 [16];
  long lVar2;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  qVar1 = QtPrivate::findByteArray
                    ((QByteArrayView)in_stack_00000020,unaff_retaddr,(char)((ulong)lVar2 >> 0x38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return qVar1;
  }
  __stack_chk_fail();
}

Assistant:

[[nodiscard]] qsizetype indexOf(char ch, qsizetype from = 0) const noexcept
    { return QtPrivate::findByteArray(*this, from, ch); }